

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32_avx2.c
# Opt level: O2

uint32_t adler32_fold_copy_impl(uint32_t adler,uint8_t *dst,uint8_t *src,size_t len,int COPY)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  sbyte sVar4;
  uint32_t uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  
  if (src == (uint8_t *)0x0) {
    adler = 1;
  }
  else {
    uVar7 = (ulong)adler;
    if (len != 0) {
      uVar8 = (ulong)(adler >> 0x10);
      uVar9 = uVar7 & 0xffff;
      auVar12 = vmovdqa64_avx512f(_DAT_00167e00);
      auVar13 = vpbroadcastw_avx512bw(ZEXT216(1));
      do {
        if (len < 0x40) {
          if (COPY != 0) {
            sVar4 = ((byte)len < 0x41) * ('@' - (byte)len);
            uVar9 = (ulong)(-1L << sVar4) >> sVar4;
            auVar12 = vmovdqu8_avx512bw(*(undefined1 (*) [64])src);
            auVar13[1] = ((byte)(uVar9 >> 1) & 1) * auVar12[1];
            auVar13[0] = ((byte)uVar9 & 1) * auVar12[0];
            auVar13[2] = ((byte)(uVar9 >> 2) & 1) * auVar12[2];
            auVar13[3] = ((byte)(uVar9 >> 3) & 1) * auVar12[3];
            auVar13[4] = ((byte)(uVar9 >> 4) & 1) * auVar12[4];
            auVar13[5] = ((byte)(uVar9 >> 5) & 1) * auVar12[5];
            auVar13[6] = ((byte)(uVar9 >> 6) & 1) * auVar12[6];
            auVar13[7] = ((byte)(uVar9 >> 7) & 1) * auVar12[7];
            auVar13[8] = ((byte)(uVar9 >> 8) & 1) * auVar12[8];
            auVar13[9] = ((byte)(uVar9 >> 9) & 1) * auVar12[9];
            auVar13[10] = ((byte)(uVar9 >> 10) & 1) * auVar12[10];
            auVar13[0xb] = ((byte)(uVar9 >> 0xb) & 1) * auVar12[0xb];
            auVar13[0xc] = ((byte)(uVar9 >> 0xc) & 1) * auVar12[0xc];
            auVar13[0xd] = ((byte)(uVar9 >> 0xd) & 1) * auVar12[0xd];
            auVar13[0xe] = ((byte)(uVar9 >> 0xe) & 1) * auVar12[0xe];
            auVar13[0xf] = ((byte)(uVar9 >> 0xf) & 1) * auVar12[0xf];
            auVar13[0x10] = ((byte)(uVar9 >> 0x10) & 1) * auVar12[0x10];
            auVar13[0x11] = ((byte)(uVar9 >> 0x11) & 1) * auVar12[0x11];
            auVar13[0x12] = ((byte)(uVar9 >> 0x12) & 1) * auVar12[0x12];
            auVar13[0x13] = ((byte)(uVar9 >> 0x13) & 1) * auVar12[0x13];
            auVar13[0x14] = ((byte)(uVar9 >> 0x14) & 1) * auVar12[0x14];
            auVar13[0x15] = ((byte)(uVar9 >> 0x15) & 1) * auVar12[0x15];
            auVar13[0x16] = ((byte)(uVar9 >> 0x16) & 1) * auVar12[0x16];
            auVar13[0x17] = ((byte)(uVar9 >> 0x17) & 1) * auVar12[0x17];
            auVar13[0x18] = ((byte)(uVar9 >> 0x18) & 1) * auVar12[0x18];
            auVar13[0x19] = ((byte)(uVar9 >> 0x19) & 1) * auVar12[0x19];
            auVar13[0x1a] = ((byte)(uVar9 >> 0x1a) & 1) * auVar12[0x1a];
            auVar13[0x1b] = ((byte)(uVar9 >> 0x1b) & 1) * auVar12[0x1b];
            auVar13[0x1c] = ((byte)(uVar9 >> 0x1c) & 1) * auVar12[0x1c];
            auVar13[0x1d] = ((byte)(uVar9 >> 0x1d) & 1) * auVar12[0x1d];
            auVar13[0x1e] = ((byte)(uVar9 >> 0x1e) & 1) * auVar12[0x1e];
            auVar13[0x1f] = ((byte)(uVar9 >> 0x1f) & 1) * auVar12[0x1f];
            auVar13[0x20] = ((byte)(uVar9 >> 0x20) & 1) * auVar12[0x20];
            auVar13[0x21] = ((byte)(uVar9 >> 0x21) & 1) * auVar12[0x21];
            auVar13[0x22] = ((byte)(uVar9 >> 0x22) & 1) * auVar12[0x22];
            auVar13[0x23] = ((byte)(uVar9 >> 0x23) & 1) * auVar12[0x23];
            auVar13[0x24] = ((byte)(uVar9 >> 0x24) & 1) * auVar12[0x24];
            auVar13[0x25] = ((byte)(uVar9 >> 0x25) & 1) * auVar12[0x25];
            auVar13[0x26] = ((byte)(uVar9 >> 0x26) & 1) * auVar12[0x26];
            auVar13[0x27] = ((byte)(uVar9 >> 0x27) & 1) * auVar12[0x27];
            auVar13[0x28] = ((byte)(uVar9 >> 0x28) & 1) * auVar12[0x28];
            auVar13[0x29] = ((byte)(uVar9 >> 0x29) & 1) * auVar12[0x29];
            auVar13[0x2a] = ((byte)(uVar9 >> 0x2a) & 1) * auVar12[0x2a];
            auVar13[0x2b] = ((byte)(uVar9 >> 0x2b) & 1) * auVar12[0x2b];
            auVar13[0x2c] = ((byte)(uVar9 >> 0x2c) & 1) * auVar12[0x2c];
            auVar13[0x2d] = ((byte)(uVar9 >> 0x2d) & 1) * auVar12[0x2d];
            auVar13[0x2e] = ((byte)(uVar9 >> 0x2e) & 1) * auVar12[0x2e];
            auVar13[0x2f] = ((byte)(uVar9 >> 0x2f) & 1) * auVar12[0x2f];
            auVar13[0x30] = ((byte)(uVar9 >> 0x30) & 1) * auVar12[0x30];
            auVar13[0x31] = ((byte)(uVar9 >> 0x31) & 1) * auVar12[0x31];
            auVar13[0x32] = ((byte)(uVar9 >> 0x32) & 1) * auVar12[0x32];
            auVar13[0x33] = ((byte)(uVar9 >> 0x33) & 1) * auVar12[0x33];
            auVar13[0x34] = ((byte)(uVar9 >> 0x34) & 1) * auVar12[0x34];
            auVar13[0x35] = ((byte)(uVar9 >> 0x35) & 1) * auVar12[0x35];
            auVar13[0x36] = ((byte)(uVar9 >> 0x36) & 1) * auVar12[0x36];
            auVar13[0x37] = ((byte)(uVar9 >> 0x37) & 1) * auVar12[0x37];
            bVar1 = (byte)(uVar9 >> 0x38);
            auVar13[0x38] = (bVar1 & 1) * auVar12[0x38];
            auVar13[0x39] = (bVar1 >> 1 & 1) * auVar12[0x39];
            auVar13[0x3a] = (bVar1 >> 2 & 1) * auVar12[0x3a];
            auVar13[0x3b] = (bVar1 >> 3 & 1) * auVar12[0x3b];
            auVar13[0x3c] = (bVar1 >> 4 & 1) * auVar12[0x3c];
            auVar13[0x3d] = (bVar1 >> 5 & 1) * auVar12[0x3d];
            auVar13[0x3e] = (bVar1 >> 6 & 1) * auVar12[0x3e];
            auVar13[0x3f] = -((char)bVar1 >> 7) * auVar12[0x3f];
            auVar12 = vmovdqu8_avx512bw(auVar13);
            *(undefined1 (*) [64])dst = auVar12;
          }
          uVar5 = adler32_avx2((uint32_t)uVar7,src,len);
          return uVar5;
        }
        while( true ) {
          if (len < 0x40) break;
          uVar10 = 0x15b0;
          if (len < 0x15b0) {
            uVar10 = (uint)len;
          }
          auVar18 = ZEXT464((uint)uVar9);
          auVar16 = ZEXT464((uint)uVar8);
          auVar17 = ZEXT1664((undefined1  [16])0x0);
          for (lVar6 = -(ulong)(uVar10 & 0x1fc0); lVar6 != 0; lVar6 = lVar6 + 0x40) {
            auVar14 = vmovdqu64_avx512f(*(undefined1 (*) [64])src);
            if (COPY != 0) {
              auVar15 = vmovdqu64_avx512f(auVar14);
              *(undefined1 (*) [64])dst = auVar15;
              dst = (uint8_t *)((long)dst + 0x40);
            }
            src = (uint8_t *)((long)src + 0x40);
            auVar15 = vpsadbw_avx512bw(auVar14,ZEXT1664((undefined1  [16])0x0));
            auVar14 = vpmaddubsw_avx512bw(auVar14,auVar12);
            auVar14 = vpmaddwd_avx512bw(auVar14,auVar13);
            auVar17 = vpaddd_avx512f(auVar18,auVar17);
            auVar18 = vpaddd_avx512f(auVar18,auVar15);
            auVar16 = vpaddd_avx512f(auVar14,auVar16);
          }
          auVar11 = vpmovqd_avx512f(auVar18);
          auVar2 = vpaddd_avx(auVar11._16_16_,auVar11._0_16_);
          auVar2 = vphaddd_avx(auVar2,auVar2);
          auVar2 = vphaddd_avx(auVar2,auVar2);
          uVar9 = (ulong)auVar2._0_4_ % 0xfff1;
          auVar17 = vpslld_avx512f(auVar17,6);
          auVar17 = vpaddd_avx512f(auVar16,auVar17);
          auVar11 = vextracti64x4_avx512f(auVar17,1);
          auVar11 = vpaddd_avx2(auVar11,auVar17._0_32_);
          auVar2 = vpaddd_avx(auVar11._16_16_,auVar11._0_16_);
          auVar3 = vpshufd_avx(auVar2,0xee);
          auVar2 = vpaddd_avx(auVar2,auVar3);
          auVar2 = vphaddd_avx(auVar2,auVar2);
          len = len - (uVar10 & 0x1fc0);
          uVar8 = (ulong)auVar2._0_4_ % 0xfff1;
        }
        adler = (uint)uVar8 << 0x10 | (uint)uVar9;
        uVar7 = (ulong)adler;
      } while (len != 0);
    }
  }
  return adler;
}

Assistant:

static inline uint32_t adler32_fold_copy_impl(uint32_t adler, uint8_t *dst, const uint8_t *src, size_t len, const int COPY) {
    if (src == NULL) return 1L;
    if (len == 0) return adler;

    uint32_t adler0, adler1;
    adler1 = (adler >> 16) & 0xffff;
    adler0 = adler & 0xffff;

rem_peel:
    if (len < 16) {
        if (COPY) {
            return adler32_copy_len_16(adler0, src, dst, len, adler1);
        } else {
            return adler32_len_16(adler0, src, len, adler1);
        }
    } else if (len < 32) {
        if (COPY) {
            return adler32_fold_copy_sse42(adler, dst, src, len);
        } else {
            return adler32_ssse3(adler, src, len);
        }
    }

    __m256i vs1, vs2;

    const __m256i dot2v = _mm256_setr_epi8(32, 31, 30, 29, 28, 27, 26, 25, 24, 23, 22, 21, 20, 19, 18, 17, 16, 15,
                                           14, 13, 12, 11, 10, 9, 8, 7, 6, 5, 4, 3, 2, 1);
    const __m256i dot3v = _mm256_set1_epi16(1);
    const __m256i zero = _mm256_setzero_si256();

    while (len >= 32) {
        vs1 = _mm256_zextsi128_si256(_mm_cvtsi32_si128(adler0));
        vs2 = _mm256_zextsi128_si256(_mm_cvtsi32_si128(adler1));
        __m256i vs1_0 = vs1;
        __m256i vs3 = _mm256_setzero_si256();

        size_t k = MIN(len, NMAX);
        k -= k % 32;
        len -= k;

        while (k >= 32) {
            /*
               vs1 = adler + sum(c[i])
               vs2 = sum2 + 32 vs1 + sum( (32-i+1) c[i] )
            */
            __m256i vbuf = _mm256_loadu_si256((__m256i*)src);
            src += 32;
            k -= 32;

            __m256i vs1_sad = _mm256_sad_epu8(vbuf, zero); // Sum of abs diff, resulting in 2 x int32's

            if (COPY) {
                _mm256_storeu_si256((__m256i*)dst, vbuf);
                dst += 32;
            }
 
            vs1 = _mm256_add_epi32(vs1, vs1_sad);
            vs3 = _mm256_add_epi32(vs3, vs1_0);
            __m256i v_short_sum2 = _mm256_maddubs_epi16(vbuf, dot2v); // sum 32 uint8s to 16 shorts
            __m256i vsum2 = _mm256_madd_epi16(v_short_sum2, dot3v); // sum 16 shorts to 8 uint32s
            vs2 = _mm256_add_epi32(vsum2, vs2);
            vs1_0 = vs1;
        }

        /* Defer the multiplication with 32 to outside of the loop */
        vs3 = _mm256_slli_epi32(vs3, 5);
        vs2 = _mm256_add_epi32(vs2, vs3);

        /* The compiler is generating the following sequence for this integer modulus
         * when done the scalar way, in GPRs:

         adler = (s1_unpack[0] % BASE) + (s1_unpack[1] % BASE) + (s1_unpack[2] % BASE) + (s1_unpack[3] % BASE) +
                 (s1_unpack[4] % BASE) + (s1_unpack[5] % BASE) + (s1_unpack[6] % BASE) + (s1_unpack[7] % BASE);

         mov    $0x80078071,%edi // move magic constant into 32 bit register %edi
         ...
         vmovd  %xmm1,%esi // move vector lane 0 to 32 bit register %esi
         mov    %rsi,%rax  // zero-extend this value to 64 bit precision in %rax
         imul   %rdi,%rsi // do a signed multiplication with magic constant and vector element
         shr    $0x2f,%rsi // shift right by 47
         imul   $0xfff1,%esi,%esi // do a signed multiplication with value truncated to 32 bits with 0xfff1
         sub    %esi,%eax // subtract lower 32 bits of original vector value from modified one above
         ...
         // repeats for each element with vpextract instructions

         This is tricky with AVX2 for a number of reasons:
             1.) There's no 64 bit multiplication instruction, but there is a sequence to get there
             2.) There's ways to extend vectors to 64 bit precision, but no simple way to truncate
                 back down to 32 bit precision later (there is in AVX512)
             3.) Full width integer multiplications aren't cheap

         We can, however, do a relatively cheap sequence for horizontal sums.
         Then, we simply do the integer modulus on the resulting 64 bit GPR, on a scalar value. It was
         previously thought that casting to 64 bit precision was needed prior to the horizontal sum, but
         that is simply not the case, as NMAX is defined as the maximum number of scalar sums that can be
         performed on the maximum possible inputs before overflow
         */


         /* In AVX2-land, this trip through GPRs will probably be unavoidable, as there's no cheap and easy
          * conversion from 64 bit integer to 32 bit (needed for the inexpensive modulus with a constant).
          * This casting to 32 bit is cheap through GPRs (just register aliasing). See above for exactly
          * what the compiler is doing to avoid integer divisions. */
         adler0 = partial_hsum256(vs1) % BASE;
         adler1 = hsum256(vs2) % BASE;
    }

    adler = adler0 | (adler1 << 16);

    if (len) {
        goto rem_peel;
    }

    return adler;
}